

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.h
# Opt level: O3

void __thiscall double_conversion::Bignum::AssignHexString(Bignum *this,Vector<const_char> value)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  this->used_bigits_ = 0;
  this->exponent_ = 0;
  iVar3 = value.length_;
  if (0x380 < iVar3) {
    abort();
  }
  if (iVar3 != 0) {
    lVar5 = (long)iVar3;
    iVar3 = 0;
    uVar4 = 0;
    uVar2 = 0;
    do {
      iVar6 = (int)value.start_[lVar5 + -1];
      if (iVar6 - 0x30U < 10) {
        uVar7 = (ulong)(iVar6 - 0x30U);
      }
      else if (iVar6 - 0x61U < 6) {
        uVar7 = (ulong)(iVar6 - 0x57);
      }
      else {
        uVar7 = (long)iVar6 - 0x37;
      }
      uVar4 = uVar4 | uVar7 << ((byte)iVar3 & 0x3f);
      if (iVar3 < 0x18) {
        iVar3 = iVar3 + 4;
      }
      else {
        lVar8 = (long)(short)uVar2;
        uVar2 = uVar2 + 1;
        this->used_bigits_ = uVar2;
        this->bigits_buffer_[lVar8] = (uint)uVar4 & 0xfffffff;
        iVar3 = iVar3 + -0x18;
        uVar4 = uVar4 >> 0x1c;
      }
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if (uVar4 != 0) {
      lVar5 = (long)(short)uVar2;
      uVar2 = uVar2 + 1;
      this->used_bigits_ = uVar2;
      this->bigits_buffer_[lVar5] = (uint)uVar4 & 0xfffffff;
    }
    if ((short)uVar2 < 1) {
      if (uVar2 != 0) {
        return;
      }
    }
    else {
      do {
        if (this->bigits_buffer_[uVar2 - 1] != 0) {
          return;
        }
        this->used_bigits_ = uVar2 - 1;
        bVar1 = 1 < (short)uVar2;
        uVar2 = uVar2 - 1;
      } while (bVar1);
    }
  }
  this->exponent_ = 0;
  return;
}

Assistant:

void Zero() {
    used_bigits_ = 0;
    exponent_ = 0;
  }